

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

word If_Dec6Perform(word t,int fDerive)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  word *pwVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  int Pla2Var [6];
  int Var2Pla [6];
  int Pla2Var_1 [6];
  int aiStack_f8 [6];
  code *pcStack_e0;
  ulong local_d0;
  uint local_c8 [2];
  undefined8 uStack_c0;
  ulong local_b8;
  ulong local_a8;
  int local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int aiStack_80 [4];
  undefined8 uStack_70;
  ulong local_68;
  word *local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pwVar12 = Truth6;
  lVar4 = 0;
  do {
    if ((*pwVar12 & t) >> ((byte)(1 << ((byte)lVar4 & 0x1f)) & 0x3f) == (~*pwVar12 & t)) {
      pcStack_e0 = (code *)0x412b03;
      __assert_fail("If_Dec6HasVar( t, i )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                    ,0x1ab,"word If_Dec6Perform(word, int)");
    }
    *(uint *)((long)&local_98 + lVar4 * 4) = (uint)lVar4;
    local_c8[lVar4] = (uint)lVar4;
    lVar4 = lVar4 + 1;
    pwVar12 = pwVar12 + 1;
  } while (lVar4 != 6);
  uVar13 = 0;
  local_d0 = 1;
  uVar5 = 0;
  local_9c = fDerive;
  do {
    local_50 = local_d0;
    if (uVar13 < 5) {
      local_a8 = uVar13;
      do {
        iVar7 = *(int *)((long)&local_98 + uVar13 * 4);
        if (iVar7 < 0) {
LAB_00412a68:
          pcStack_e0 = (code *)0x412a87;
          __assert_fail("Var2Pla[v] >= p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0xf0,"word If_Dec6MoveTo(word, int, int, int *, int *)");
        }
        while (iVar7 != 0) {
          if (5 < iVar7) goto LAB_00412a49;
          uVar9 = PMasks[(long)iVar7 + -1][0];
          uVar16 = PMasks[(long)iVar7 + -1][1];
          bVar6 = (byte)(1 << ((char)iVar7 - 1U & 0x1f));
          uVar3 = PMasks[(long)iVar7 + -1][2];
          uVar8 = local_c8[(long)iVar7 + -1];
          piVar1 = (int *)((long)&local_98 + (long)(int)uVar8 * 4);
          *piVar1 = *piVar1 + 1;
          uVar14 = local_c8[iVar7];
          piVar1 = (int *)((long)&local_98 + (long)(int)uVar14 * 4);
          *piVar1 = *piVar1 + -1;
          t = (t & uVar3) >> (bVar6 & 0x3f) | (uVar16 & t) << (bVar6 & 0x3f) | uVar9 & t;
          local_c8[(long)iVar7 + -1] = uVar14 ^ uVar8;
          local_c8[iVar7] = uVar8;
          local_c8[(long)iVar7 + -1] = uVar14;
          iVar7 = *(int *)((long)&local_98 + uVar13 * 4);
        }
        if (uVar13 != local_c8[0]) {
LAB_00412a87:
          pcStack_e0 = (code *)0x412aa6;
          __assert_fail("Pla2Var[p] == v",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0xfc,"word If_Dec6MoveTo(word, int, int, int *, int *)");
        }
        iVar7 = *(int *)((long)&local_98 + local_d0 * 4);
        if (iVar7 < 1) goto LAB_00412a68;
        while (iVar7 != 1) {
          if (5 < iVar7) {
LAB_00412a49:
            pcStack_e0 = (code *)0x412a68;
            __assert_fail("v < 5",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                          ,0xea,"word If_Dec6SwapAdjacent(word, int)");
          }
          uVar9 = PMasks[(long)iVar7 + -1][0];
          uVar16 = PMasks[(long)iVar7 + -1][1];
          bVar6 = (byte)(1 << ((char)iVar7 - 1U & 0x1f));
          uVar3 = PMasks[(long)iVar7 + -1][2];
          uVar8 = local_c8[(long)iVar7 + -1];
          piVar1 = (int *)((long)&local_98 + (long)(int)uVar8 * 4);
          *piVar1 = *piVar1 + 1;
          uVar14 = local_c8[iVar7];
          piVar1 = (int *)((long)&local_98 + (long)(int)uVar14 * 4);
          *piVar1 = *piVar1 + -1;
          t = (t & uVar3) >> (bVar6 & 0x3f) | (uVar16 & t) << (bVar6 & 0x3f) | uVar9 & t;
          local_c8[(long)iVar7 + -1] = uVar14 ^ uVar8;
          local_c8[iVar7] = uVar8;
          local_c8[(long)iVar7 + -1] = uVar14;
          iVar7 = *(int *)((long)&local_98 + local_d0 * 4);
        }
        if (local_d0 != local_c8[1]) goto LAB_00412a87;
        lVar4 = 0;
        uVar8 = 0;
        uVar9 = 0;
        do {
          uVar8 = uVar8 & 0xff | ((uint)uVar9 & 0xff) << 8 |
                  1 << ((byte)(t >> ((byte)lVar4 & 0x3f)) & 0xf);
          uVar9 = (ulong)(uVar8 >> 8);
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x40);
        iVar7 = BitCount8[uVar9] + BitCount8[uVar8 & 0xff];
        if (iVar7 < 2) {
          pcStack_e0 = If_Dec7Perform;
          __assert_fail("Count > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0x1b7,"word If_Dec6Perform(word, int)");
        }
        if (iVar7 == 2) {
          if (fDerive != 0) {
            uVar14 = (uint)t & 0xf;
            lVar4 = 4;
            bVar6 = 1;
            uVar19 = 0;
            uVar8 = uVar14;
            do {
              uVar10 = (uint)(t >> ((byte)lVar4 & 0x3f)) & 0xf;
              uVar15 = 1 << (bVar6 & 0x1f);
              if (uVar10 == uVar14) {
                uVar15 = 0;
                uVar10 = uVar8;
              }
              uVar8 = uVar10;
              uVar19 = uVar19 | uVar15;
              lVar4 = lVar4 + 4;
              bVar6 = bVar6 + 1;
            } while (lVar4 != 0x40);
            uVar13 = (ulong)(int)uVar19;
            lVar4 = 0x10;
            do {
              uVar13 = uVar13 | (long)*(int *)((long)local_c8 + lVar4 + -8) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 4;
            } while (lVar4 != 0x20);
            uVar5 = (ulong)(uVar8 << 4 | uVar14);
            uVar13 = uVar5 << 0x28 | uVar5 << 0x20 | uVar13;
            lVar4 = 0x30;
            do {
              uVar13 = uVar13 | (long)*(int *)((long)aiStack_f8 + lVar4) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 4;
            } while (lVar4 == 0x34);
            return uVar13 | 0x700000000000000;
          }
          return 1;
        }
        if (uVar5 == 0) {
          if (iVar7 - 3U < 2) {
            local_58 = PMasks[2] + 2;
            uVar5 = 0;
            uVar9 = 0;
            do {
              uVar16 = ~Truth6[uVar9 + 2] & t;
              bVar6 = (byte)(4 << ((byte)uVar9 & 0x1f));
              uVar13 = Truth6[uVar9 + 2] & t;
              lVar4 = 0;
              uVar8 = 0;
              uVar14 = 0;
              do {
                uVar8 = uVar8 & 0xff | (uVar14 & 0xff) << 8 |
                        1 << ((byte)((uVar16 << (bVar6 & 0x3f) | uVar16) >> ((byte)lVar4 & 0x3f)) &
                             0xf);
                uVar14 = uVar8 >> 8;
                lVar4 = lVar4 + 4;
              } while (lVar4 != 0x40);
              bVar20 = true;
              if (BitCount8[uVar14] + BitCount8[uVar8 & 0xff] < 3) {
                lVar4 = 0;
                uVar8 = 0;
                uVar16 = 0;
                do {
                  uVar8 = uVar8 & 0xff | ((uint)uVar16 & 0xff) << 8 |
                          1 << ((uint)((uVar13 >> (bVar6 & 0x3f) | uVar13) >> ((byte)lVar4 & 0x3f))
                               & 0xf);
                  uVar16 = (ulong)(uVar8 >> 8);
                  lVar4 = lVar4 + 4;
                } while (lVar4 != 0x40);
                bVar20 = 2 < BitCount8[uVar16] + BitCount8[uVar8 & 0xff];
                if (BitCount8[uVar16] + BitCount8[uVar8 & 0xff] < 3) {
                  uVar5 = 1;
                }
                if (fDerive != 0 && !bVar20) {
                  uStack_70 = uStack_c0;
                  local_68 = local_b8;
                  local_48 = local_98;
                  uStack_40 = uStack_90;
                  local_38 = local_88;
                  uVar5 = t;
                  pwVar12 = local_58;
                  for (uVar13 = uVar9; uVar13 != 3; uVar13 = uVar13 + 1) {
                    bVar6 = (byte)(1 << ((char)uVar13 + 2U & 0x1f));
                    uVar5 = (uVar5 & *pwVar12) >> (bVar6 & 0x3f) |
                            (pwVar12[-1] & uVar5) << (bVar6 & 0x3f) |
                            (*(word (*) [3])(pwVar12 + -2))[0] & uVar5;
                    iVar7 = *(int *)((long)&uStack_70 + uVar13 * 4);
                    piVar1 = (int *)((long)&local_48 + (long)iVar7 * 4);
                    *piVar1 = *piVar1 + 1;
                    iVar2 = *(int *)((long)&uStack_70 + uVar13 * 4 + 4);
                    piVar1 = (int *)((long)&local_48 + (long)iVar2 * 4);
                    *piVar1 = *piVar1 + -1;
                    *(int *)((long)&uStack_70 + uVar13 * 4 + 4) = iVar7;
                    *(int *)((long)&uStack_70 + uVar13 * 4) = iVar2;
                    pwVar12 = pwVar12 + 3;
                  }
                  uVar13 = uVar5 << 0x20 | uVar5 & 0xffffffff;
                  lVar4 = 0;
                  uVar8 = 0;
                  uVar14 = 0;
                  do {
                    uVar8 = uVar8 & 0xff | (uVar14 & 0xff) << 8 |
                            1 << ((uint)(uVar13 >> ((byte)lVar4 & 0x3f)) & 0xf);
                    uVar14 = uVar8 >> 8;
                    lVar4 = lVar4 + 4;
                  } while (lVar4 != 0x40);
                  if (2 < BitCount8[uVar14] + BitCount8[uVar8 & 0xff]) {
                    pcStack_e0 = (code *)0x412ac5;
                    __assert_fail("2 >= If_Dec6CofCount2(c0)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                                  ,0x16b,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
                  }
                  uVar16 = uVar5 & 0xffffffff00000000 | uVar5 >> 0x20;
                  lVar4 = 0;
                  uVar8 = 0;
                  uVar14 = 0;
                  do {
                    uVar8 = uVar8 & 0xff | (uVar14 & 0xff) << 8 |
                            1 << ((byte)(uVar16 >> ((byte)lVar4 & 0x3f)) & 0xf);
                    uVar14 = uVar8 >> 8;
                    lVar4 = lVar4 + 4;
                  } while (lVar4 != 0x40);
                  if (2 < BitCount8[uVar14] + BitCount8[uVar8 & 0xff]) {
                    pcStack_e0 = (code *)0x412ae4;
                    __assert_fail("2 >= If_Dec6CofCount2(c1)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                                  ,0x16c,"word If_Dec6DeriveNonDisjoint(word, int, int *, int *)");
                  }
                  uVar14 = (uint)uVar5 & 0xf;
                  uVar19 = 0;
                  lVar4 = 4;
                  bVar6 = 1;
                  uVar8 = uVar14;
                  do {
                    uVar15 = (uint)(uVar13 >> ((byte)lVar4 & 0x3f)) & 0xf;
                    uVar10 = 1 << (bVar6 & 0x1f);
                    if (uVar15 == uVar14) {
                      uVar10 = 0;
                      uVar15 = uVar8;
                    }
                    uVar8 = uVar15;
                    uVar19 = uVar19 | uVar10;
                    lVar4 = lVar4 + 4;
                    bVar6 = bVar6 + 1;
                  } while (lVar4 != 0x40);
                  uVar17 = (uint)(uVar5 >> 0x20) & 0xf;
                  uVar15 = 0;
                  lVar4 = 4;
                  bVar6 = 1;
                  uVar10 = uVar17;
                  do {
                    uVar11 = (uint)(uVar16 >> ((byte)lVar4 & 0x3f)) & 0xf;
                    uVar18 = 1 << (bVar6 & 0x1f);
                    if (uVar11 == uVar17) {
                      uVar18 = 0;
                      uVar11 = uVar10;
                    }
                    uVar10 = uVar11;
                    uVar15 = uVar15 | uVar18;
                    lVar4 = lVar4 + 4;
                    bVar6 = bVar6 + 1;
                  } while (lVar4 != 0x40);
                  uVar5 = (ulong)(uVar19 & 0xff | (uVar15 & 0xff) << 8);
                  lVar4 = 0x10;
                  do {
                    uVar5 = uVar5 | (long)*(int *)((long)aiStack_80 + lVar4) << ((byte)lVar4 & 0x3f)
                    ;
                    lVar4 = lVar4 + 4;
                  } while (lVar4 != 0x20);
                  uVar5 = (ulong)(uVar10 << 4 | uVar17) << 0x28 |
                          (ulong)(uVar8 << 4 | uVar14) << 0x20 | uVar5;
                  lVar4 = 0x30;
                  do {
                    uVar5 = uVar5 | (long)*(int *)((long)&local_a8 + lVar4) << ((byte)lVar4 & 0x3f);
                    lVar4 = lVar4 + 4;
                  } while (lVar4 == 0x34);
                  uVar5 = uVar5 | (local_68 >> 0x20) << 0x3c | 0x700000000000000;
                  bVar20 = false;
                  fDerive = local_9c;
                }
              }
              uVar13 = local_a8;
              if (!bVar20) break;
              local_58 = local_58 + 3;
              bVar20 = uVar9 < 3;
              uVar9 = uVar9 + 1;
            } while (bVar20);
          }
          else {
            uVar5 = 0;
          }
        }
        local_d0 = local_d0 + 1;
      } while (local_d0 != 6);
    }
    uVar13 = uVar13 + 1;
    local_d0 = local_50 + 1;
    if (uVar13 == 6) {
      return uVar5;
    }
  } while( true );
}

Assistant:

word If_Dec6Perform( word t, int fDerive )
{ 
    word r = 0;
    int i, v, u, x, Count, Pla2Var[6], Var2Pla[6];
    // start arrays
    for ( i = 0; i < 6; i++ )
    {
        assert( If_Dec6HasVar( t, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
    // generate permutations
    i = 0;
    for ( v = 0;   v < 6; v++ )
    for ( u = v+1; u < 6; u++, i++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        t = If_Dec6MoveTo( t, u, 1, Pla2Var, Var2Pla );
//        If_DecVerifyPerm( Pla2Var, Var2Pla );
        Count = If_Dec6CofCount2( t );
        assert( Count > 1 );
        if ( Count == 2 )
            return !fDerive ? 1 : If_Dec6DeriveDisjoint( t, Pla2Var, Var2Pla );
        // check non-disjoint decomposition
        if ( !r && (Count == 3 || Count == 4) )
        {
            for ( x = 0; x < 4; x++ )
            {
                word c0 = If_Dec6Cofactor( t, x+2, 0 );
                word c1 = If_Dec6Cofactor( t, x+2, 1 );
                if ( If_Dec6CofCount2( c0 ) <= 2 && If_Dec6CofCount2( c1 ) <= 2 )
                {
                    r = !fDerive ? 1 : If_Dec6DeriveNonDisjoint( t, x+2, Pla2Var, Var2Pla );
                    break;
                }
            }
        }
    }
    assert( i == 15 );
    return r;
}